

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

OutputMode __thiscall
google::protobuf::compiler::js::GeneratorOptions::output_mode(GeneratorOptions *this)

{
  if ((this->import_style == kImportClosure) && (this->one_output_file_per_input_file == false)) {
    return kEverythingInOneFile - ((this->library)._M_string_length == 0);
  }
  return kOneOutputFilePerInputFile;
}

Assistant:

GeneratorOptions::OutputMode GeneratorOptions::output_mode() const {
  // We use one output file per input file if we are not using Closure or if
  // this is explicitly requested.
  if (import_style != kImportClosure || one_output_file_per_input_file) {
    return kOneOutputFilePerInputFile;
  }

  // If a library name is provided, we put everything in that one file.
  if (!library.empty()) {
    return kEverythingInOneFile;
  }

  // Otherwise, we create one output file per type.
  return kOneOutputFilePerType;
}